

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

void * libssh2_session_callback_set(LIBSSH2_SESSION *session,int cbtype,void *callback)

{
  void *oldcb;
  void *callback_local;
  int cbtype_local;
  LIBSSH2_SESSION *session_local;
  
  switch(cbtype) {
  case 0:
    session_local = (LIBSSH2_SESSION *)session->ssh_msg_ignore;
    session->ssh_msg_ignore = (_func_void_LIBSSH2_SESSION_ptr_char_ptr_int_void_ptr_ptr *)callback;
    break;
  case 1:
    session_local = (LIBSSH2_SESSION *)session->ssh_msg_debug;
    session->ssh_msg_debug =
         (_func_void_LIBSSH2_SESSION_ptr_int_char_ptr_int_char_ptr_int_void_ptr_ptr *)callback;
    break;
  case 2:
    session_local = (LIBSSH2_SESSION *)session->ssh_msg_disconnect;
    session->ssh_msg_disconnect =
         (_func_void_LIBSSH2_SESSION_ptr_int_char_ptr_int_char_ptr_int_void_ptr_ptr *)callback;
    break;
  case 3:
    session_local = (LIBSSH2_SESSION *)session->macerror;
    session->macerror = (_func_int_LIBSSH2_SESSION_ptr_char_ptr_int_void_ptr_ptr *)callback;
    break;
  case 4:
    session_local = (LIBSSH2_SESSION *)session->x11;
    session->x11 = (_func_void_LIBSSH2_SESSION_ptr_LIBSSH2_CHANNEL_ptr_char_ptr_int_void_ptr_ptr *)
                   callback;
    break;
  case 5:
    session_local = (LIBSSH2_SESSION *)session->send;
    session->send = (_func_ssize_t_libssh2_socket_t_void_ptr_size_t_int_void_ptr_ptr *)callback;
    break;
  case 6:
    session_local = (LIBSSH2_SESSION *)session->recv;
    session->recv = (_func_ssize_t_libssh2_socket_t_void_ptr_size_t_int_void_ptr_ptr *)callback;
    break;
  case 7:
    session_local = (LIBSSH2_SESSION *)session->authagent;
    session->authagent = (_func_void_LIBSSH2_SESSION_ptr_LIBSSH2_CHANNEL_ptr_void_ptr_ptr *)callback
    ;
    break;
  case 8:
    session_local = (LIBSSH2_SESSION *)session->addLocalIdentities;
    session->addLocalIdentities =
         (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)callback;
    break;
  case 9:
    session_local = (LIBSSH2_SESSION *)session->agentSignCallback;
    session->agentSignCallback =
         (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_uint_uchar_ptr_uint_uchar_ptr_ptr_uint_ptr_char_ptr_void_ptr_ptr
          *)callback;
    break;
  default:
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  return session_local;
}

Assistant:

LIBSSH2_API void *
libssh2_session_callback_set(LIBSSH2_SESSION * session,
                             int cbtype, void *callback)
{
    void *oldcb;

    switch(cbtype) {
    case LIBSSH2_CALLBACK_IGNORE:
        oldcb = session->ssh_msg_ignore;
        session->ssh_msg_ignore = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_DEBUG:
        oldcb = session->ssh_msg_debug;
        session->ssh_msg_debug = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_DISCONNECT:
        oldcb = session->ssh_msg_disconnect;
        session->ssh_msg_disconnect = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_MACERROR:
        oldcb = session->macerror;
        session->macerror = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_X11:
        oldcb = session->x11;
        session->x11 = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_SEND:
        oldcb = session->send;
        session->send = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_RECV:
        oldcb = session->recv;
        session->recv = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_AUTHAGENT:
        oldcb = session->authagent;
        session->authagent = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_AUTHAGENT_IDENTITIES:
        oldcb = session->addLocalIdentities;
        session->addLocalIdentities = callback;
        return oldcb;

    case LIBSSH2_CALLBACK_AUTHAGENT_SIGN:
        oldcb = session->agentSignCallback;
        session->agentSignCallback = callback;
        return oldcb;
    }
    _libssh2_debug((session, LIBSSH2_TRACE_TRANS, "Setting Callback %d",
                   cbtype));

    return NULL;
}